

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O0

bool __thiscall
TestTransaction::GetVariableIntTest(TestTransaction *this,string *test_data,uint64_t *value)

{
  bool bVar1;
  uchar *p_byte_data;
  size_type data_size;
  size_t local_48;
  size_t size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_array;
  bool is_success;
  uint64_t *value_local;
  string *test_data_local;
  TestTransaction *this_local;
  
  test_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  cfd::core::StringUtil::StringToByte
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&size,(string *)test_data);
  local_48 = 0;
  p_byte_data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&size);
  data_size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&size);
  bVar1 = cfd::core::AbstractTransaction::GetVariableInt(p_byte_data,data_size,value,&local_48);
  test_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = bVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&size);
  return bVar1;
}

Assistant:

bool GetVariableIntTest(const std::string &test_data, uint64_t *value) {
    bool is_success = false;
    std::vector<uint8_t> test_array = StringUtil::StringToByte(test_data);
    size_t size = 0;
    is_success = GetVariableInt(test_array.data(), test_array.size(),
                                value, &size);
    return is_success;
  }